

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O3

ovf_file * ovf_open(char *filename)

{
  ovf_file *ovf_file_ptr;
  
  ovf_file_ptr = (ovf_file *)operator_new(0x20);
  ovf_file_initialize(ovf_file_ptr,filename);
  return ovf_file_ptr;
}

Assistant:

struct ovf_file * ovf_open(const char * filename)
try
{
    // Initialize the struct
    struct ovf_file * ovf_file_ptr = new ovf_file;
    ovf_file_initialize(ovf_file_ptr, filename);
    return ovf_file_ptr;
}
catch( ... )
{
    return nullptr;
}